

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# html.h
# Opt level: O3

void td<Result<unsigned_int,double>>(ostream *os,Result<unsigned_int,_double> *r)

{
  char cVar1;
  ostream *poVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"<tr>",4);
  cVar1 = (char)os;
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"<td>",4);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(r->description)._M_dataplus._M_p,(r->description)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</td>",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  td<Result<unsigned_int,double>>(os,&r->absoluteErrors);
  td<Result<unsigned_int,double>>(os,&r->relativeErrors);
  std::__ostream_insert<char,std::char_traits<char>>(os,"<td>",4);
  poVar2 = std::ostream::_M_insert<double>(r->stddev);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</td>",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"<td>",4);
  poVar2 = std::ostream::_M_insert<double>
                     ((double)((float)(r->callNs - r->overheadNs) / (float)r->samplesInRange));
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</td>",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"</tr>",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  return;
}

Assistant:

void td(std::ostream& os, const ResultT& r)
{
    os << "<tr>" << std::endl;
    os << "<td>" << r.description << "</td>" << std::endl;
    td<ResultT>(os, r.absoluteErrors);
    td<ResultT>(os, r.relativeErrors);
    os << "<td>" << r.stddev << "</td>" << std::endl;
    os << "<td>" << float(r.callNs - r.overheadNs) / float(r.samplesInRange) << "</td>" << std::endl;
    os << "</tr>" << std::endl;
}